

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_step_max(Integer g_a,Integer g_b,void *retval)

{
  Integer bhi [7];
  Integer *in_stack_00000048;
  Integer blo [7];
  Integer ahi [7];
  Integer *in_stack_000000c8;
  Integer alo [7];
  Integer bndim;
  Integer btype;
  Integer andim;
  Integer atype;
  undefined8 local_f8 [16];
  undefined8 local_78 [8];
  long local_38;
  long local_28;
  
  pnga_inquire(alo[2],(Integer *)alo[1],(Integer *)alo[0],in_stack_000000c8);
  pnga_inquire(alo[2],(Integer *)alo[1],(Integer *)alo[0],in_stack_000000c8);
  while (local_28 != 0) {
    local_78[local_28 + -1] = 1;
    local_28 = local_28 + -1;
    local_f8[local_38 + -1] = 1;
    local_38 = local_38 + -1;
  }
  pnga_step_max_patch(blo[0],in_stack_00000048,(Integer *)bhi[6],bhi[5],(Integer *)bhi[4],
                      (Integer *)bhi[3],(void *)blo[2]);
  return;
}

Assistant:

void pnga_step_max(Integer g_a, Integer g_b, void *retval)
{
   Integer atype, andim;
   Integer btype, bndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
 
    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    while(andim){
        alo[andim-1]=1;
        andim--;
        blo[bndim-1]=1;
        bndim--;
    }
    
#if 0
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval, OP_STEPMAX);
#else
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval);
#endif
}